

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall
QPDF::checkHPageOffset
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *shared_idx_to_obj)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Rb_tree_color _Var3;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var4;
  QPDFObjectHandle *this_00;
  pointer pQVar5;
  long lVar6;
  bool bVar7;
  _Rb_tree_color _Var8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  const_iterator cVar12;
  qpdf_offset_t qVar13;
  ulong uVar14;
  long *plVar15;
  undefined8 *puVar16;
  mapped_type *__v;
  _Base_ptr p_Var17;
  _Rb_tree_node_base *p_Var18;
  undefined1 *puVar19;
  _Rb_tree_node_base *p_Var20;
  _Base_ptr *pp_Var21;
  ulong *puVar22;
  undefined8 *puVar23;
  ulong uVar24;
  size_type *psVar25;
  _Rb_tree_header *p_Var26;
  _Base_ptr p_Var27;
  undefined1 *puVar28;
  ulong uVar29;
  _Rb_tree_header *p_Var30;
  long lVar31;
  int *piVar32;
  undefined1 *puVar33;
  uint uVar34;
  undefined8 uVar35;
  uint uVar36;
  QPDFObjGen QVar37;
  uint uVar38;
  uint uVar39;
  QPDF *pQVar40;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  int obj;
  int idx;
  string __str_2;
  string __str;
  string __str_1;
  set<int,_std::less<int>,_std::allocator<int>_> hint_shared;
  set<int,_std::less<int>,_std::allocator<int>_> computed_shared;
  string __str_6;
  string __str_5;
  string __str_4;
  QPDFObjGen page_og;
  string __str_3;
  QPDFObjGen first_page_og;
  string local_228;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  undefined8 uStack_1f0;
  QPDF *local_1e8;
  _Base_ptr *local_1e0;
  long local_1d8;
  _Base_ptr local_1d0;
  long lStack_1c8;
  ulong local_1c0;
  _Base_ptr *local_1b8;
  long local_1b0;
  _Base_ptr local_1a8;
  long lStack_1a0;
  long *local_198;
  undefined8 local_190;
  long local_188;
  undefined8 uStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  undefined1 local_158 [32];
  _Rb_tree_node_base *local_138;
  size_t local_130;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_128;
  ulong local_f8;
  QPDFObjGen local_f0;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_e8;
  _Rb_tree_header *local_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  _Base_ptr *local_b8;
  long local_b0;
  _Base_ptr local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_78;
  uint *local_70;
  QPDFObjGen local_68;
  long *local_60 [2];
  long local_50 [2];
  ulong local_40;
  QPDFObjGen local_38;
  
  local_f8 = (long)(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  local_78 = pages;
  if ((local_f8 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_f8);
  }
  _Var4._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  lVar31 = *(qpdf_offset_t *)((long)&(_Var4._M_head_impl)->page_offset_hints + 8);
  if (*(qpdf_offset_t *)((long)&(_Var4._M_head_impl)->linp + 0x30) <= lVar31) {
    lVar31 = lVar31 + *(qpdf_offset_t *)((long)&(_Var4._M_head_impl)->linp + 0x38);
  }
  this_00 = (local_78->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_1e8 = this;
  if ((local_78->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != this_00) {
    local_38 = QPDFObjectHandle::getObjGen(this_00);
    pQVar40 = local_1e8;
    _Var4._M_head_impl =
         (local_1e8->m)._M_t.
         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    cVar12 = std::
             _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
             ::find(&((_Var4._M_head_impl)->xref_table)._M_t,&local_38);
    if (cVar12._M_node == (_Base_ptr)((long)&(_Var4._M_head_impl)->xref_table + 8U)) {
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"supposed first page object is not known","");
      stopOnError(local_1e8,(string *)local_158);
      pQVar40 = local_1e8;
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        pQVar40 = local_1e8;
      }
    }
    qVar13 = getLinearizationOffset(pQVar40,local_38);
    if (lVar31 != qVar13) {
      msg._M_str = "first page object offset mismatch";
      msg._M_len = 0x21;
      linearizationWarning(pQVar40,msg);
    }
    if (0 < (int)(uint)local_f8) {
      local_e0 = &(shared_idx_to_obj->_M_t)._M_impl.super__Rb_tree_header;
      local_f8 = (ulong)((uint)local_f8 & 0x7fffffff);
      uVar24 = 0;
      local_e8 = shared_idx_to_obj;
      do {
        pQVar5 = (local_78->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar29 = (long)(local_78->
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pQVar5 >> 4;
        if (uVar29 <= uVar24) goto LAB_0022205d;
        local_f0 = QPDFObjectHandle::getObjGen(pQVar5 + uVar24);
        _Var4._M_head_impl =
             (local_1e8->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        local_68 = local_f0;
        cVar12 = std::
                 _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                 ::find(&((_Var4._M_head_impl)->xref_table)._M_t,&local_68);
        pQVar40 = local_1e8;
        if (cVar12._M_node == (_Base_ptr)((long)&(_Var4._M_head_impl)->xref_table + 8U)) {
          local_158._0_8_ = local_158 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,"unknown object in page offset hint table","");
          stopOnError(pQVar40,(string *)local_158);
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
          }
        }
        uVar14 = getLinearizationOffset(pQVar40,local_68);
        _Var4._M_head_impl =
             (pQVar40->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        lVar31 = *(long *)&((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                             *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x40))->
                           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
        ;
        uVar29 = ((long)*(pointer *)((long)&(_Var4._M_head_impl)->page_offset_hints + 0x48) - lVar31
                 >> 3) * 0x2e8ba2e8ba2e8ba3;
        if (uVar29 < uVar24 || uVar29 - uVar24 == 0) goto LAB_0022205d;
        _Var4._M_head_impl =
             (pQVar40->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        lVar6 = *(long *)&((_Var4._M_head_impl)->c_page_offset_data).entries;
        uVar29 = (long)*(pointer *)((long)&(_Var4._M_head_impl)->c_page_offset_data + 8) - lVar6 >>
                 5;
        if (uVar29 <= uVar24) goto LAB_0022205d;
        piVar32 = (int *)(lVar31 + uVar24 * 0x58);
        local_70 = (uint *)(lVar6 + uVar24 * 0x20);
        uVar36 = (((pQVar40->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->page_offset_hints).
                 min_nobjects + *piVar32;
        local_1c0 = uVar24;
        if (uVar36 != *(uint *)(lVar6 + uVar24 * 0x20)) {
          uVar34 = 1;
          if (9 < uVar24) {
            uVar38 = 4;
            uVar29 = uVar24;
            do {
              uVar34 = uVar38;
              uVar39 = (uint)uVar29;
              if (uVar39 < 100) {
                uVar34 = uVar34 - 2;
                goto LAB_002206e7;
              }
              if (uVar39 < 1000) {
                uVar34 = uVar34 - 1;
                goto LAB_002206e7;
              }
              if (uVar39 < 10000) goto LAB_002206e7;
              uVar29 = (uVar29 & 0xffffffff) / 10000;
              uVar38 = uVar34 + 4;
            } while (99999 < uVar39);
            uVar34 = uVar34 + 1;
          }
LAB_002206e7:
          local_198 = &local_188;
          local_40 = uVar14;
          std::__cxx11::string::_M_construct((ulong)&local_198,(char)uVar34);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_198,uVar34,(uint)uVar24);
          plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x289bce);
          local_1e0 = &local_1d0;
          pp_Var21 = (_Base_ptr *)(plVar15 + 2);
          if ((_Base_ptr *)*plVar15 == pp_Var21) {
            local_1d0 = *pp_Var21;
            lStack_1c8 = plVar15[3];
          }
          else {
            local_1d0 = *pp_Var21;
            local_1e0 = (_Base_ptr *)*plVar15;
          }
          local_1d8 = plVar15[1];
          *plVar15 = (long)pp_Var21;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
          puVar22 = puVar16 + 2;
          if ((ulong *)*puVar16 == puVar22) {
            local_1f8 = *puVar22;
            uStack_1f0 = puVar16[3];
            local_208 = &local_1f8;
          }
          else {
            local_1f8 = *puVar22;
            local_208 = (ulong *)*puVar16;
          }
          local_200 = puVar16[1];
          *puVar16 = puVar22;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          uVar34 = -uVar36;
          if (0 < (int)uVar36) {
            uVar34 = uVar36;
          }
          uVar38 = 1;
          if (9 < uVar34) {
            uVar29 = (ulong)uVar34;
            uVar39 = 4;
            do {
              uVar38 = uVar39;
              uVar10 = (uint)uVar29;
              if (uVar10 < 100) {
                uVar38 = uVar38 - 2;
                goto LAB_00220837;
              }
              if (uVar10 < 1000) {
                uVar38 = uVar38 - 1;
                goto LAB_00220837;
              }
              if (uVar10 < 10000) goto LAB_00220837;
              uVar29 = uVar29 / 10000;
              uVar39 = uVar38 + 4;
            } while (99999 < uVar10);
            uVar38 = uVar38 + 1;
          }
LAB_00220837:
          local_178 = &local_168;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_178,(char)uVar38 - (char)((int)uVar36 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar36 >> 0x1f) + (long)local_178),uVar38,uVar34);
          puVar9 = local_70;
          uVar29 = 0xf;
          if (local_208 != &local_1f8) {
            uVar29 = local_1f8;
          }
          if (uVar29 < (ulong)(local_170 + local_200)) {
            uVar29 = 0xf;
            if (local_178 != &local_168) {
              uVar29 = local_168;
            }
            if (uVar29 < (ulong)(local_170 + local_200)) goto LAB_002208dd;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_178,0,(char *)0x0,(ulong)local_208);
          }
          else {
LAB_002208dd:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_178);
          }
          puVar22 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_228.field_2._M_allocated_capacity = *puVar22;
            local_228.field_2._8_8_ = puVar16[3];
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          }
          else {
            local_228.field_2._M_allocated_capacity = *puVar22;
            local_228._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_228._M_string_length = puVar16[1];
          *puVar16 = puVar22;
          puVar16[1] = 0;
          *(undefined1 *)puVar22 = 0;
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
          uVar14 = local_40;
          puVar23 = puVar16 + 2;
          if ((_Base_ptr *)*puVar16 == (_Base_ptr *)puVar23) {
            local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar23;
            local_128._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar16[3];
            local_128._M_impl._0_8_ = &local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
          }
          else {
            local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar23;
            local_128._M_impl._0_8_ = (_Base_ptr *)*puVar16;
          }
          local_128._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar16[1];
          *puVar16 = puVar23;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          uVar34 = *puVar9;
          uVar38 = -uVar34;
          if (0 < (int)uVar34) {
            uVar38 = uVar34;
          }
          uVar39 = 1;
          if (9 < uVar38) {
            uVar29 = (ulong)uVar38;
            uVar10 = 4;
            do {
              uVar39 = uVar10;
              uVar11 = (uint)uVar29;
              if (uVar11 < 100) {
                uVar39 = uVar39 - 2;
                goto LAB_00220a11;
              }
              if (uVar11 < 1000) {
                uVar39 = uVar39 - 1;
                goto LAB_00220a11;
              }
              if (uVar11 < 10000) goto LAB_00220a11;
              uVar29 = uVar29 / 10000;
              uVar10 = uVar39 + 4;
            } while (99999 < uVar11);
            uVar39 = uVar39 + 1;
          }
LAB_00220a11:
          local_1b8 = &local_1a8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_1b8,(char)uVar39 - (char)((int)uVar34 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar34 >> 0x1f) + (long)local_1b8),uVar39,uVar38);
          p_Var17 = (_Base_ptr)0xf;
          if ((_Base_ptr *)local_128._M_impl._0_8_ !=
              &local_128._M_impl.super__Rb_tree_header._M_header._M_parent) {
            p_Var17 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
          }
          if (p_Var17 < (_Base_ptr)
                        (local_1b0 + local_128._M_impl.super__Rb_tree_header._M_header._0_8_)) {
            p_Var17 = (_Base_ptr)0xf;
            if (local_1b8 != &local_1a8) {
              p_Var17 = local_1a8;
            }
            if (p_Var17 < (_Base_ptr)
                          (local_1b0 + local_128._M_impl.super__Rb_tree_header._M_header._0_8_))
            goto LAB_00220ab3;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_1b8,0,(char *)0x0,local_128._M_impl._0_8_);
          }
          else {
LAB_00220ab3:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_1b8);
          }
          plVar15 = puVar16 + 2;
          if ((long *)*puVar16 == plVar15) {
            local_158._16_8_ = *plVar15;
            local_158._24_8_ = puVar16[3];
            local_158._0_8_ = local_158 + 0x10;
          }
          else {
            local_158._16_8_ = *plVar15;
            local_158._0_8_ = (long *)*puVar16;
          }
          local_158._8_8_ = puVar16[1];
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(char *)plVar15 = '\0';
          msg_00._M_str = (char *)local_158._0_8_;
          msg_00._M_len = local_158._8_8_;
          linearizationWarning(local_1e8,msg_00);
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
          }
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,(ulong)((long)&local_1a8->_M_color + 1));
          }
          if ((_Base_ptr *)local_128._M_impl._0_8_ !=
              &local_128._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)local_128._M_impl._0_8_,
                            (ulong)((long)&(local_128._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168 + 1);
          }
          if (local_208 != &local_1f8) {
            operator_delete(local_208,local_1f8 + 1);
          }
          if (local_1e0 != &local_1d0) {
            operator_delete(local_1e0,(ulong)((long)&local_1d0->_M_color + 1));
          }
          shared_idx_to_obj = local_e8;
          if (local_198 != &local_188) {
            operator_delete(local_198,local_188 + 1);
            shared_idx_to_obj = local_e8;
          }
        }
        pQVar40 = local_1e8;
        uVar36 = lengthNextN(local_1e8,local_f0.obj,uVar36);
        QVar37.gen = 0;
        QVar37.obj = uVar36;
        lVar31 = (long)*(int *)((long)&((pQVar40->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                       ->page_offset_hints + 0x14) + *(long *)(piVar32 + 2);
        uVar34 = (uint)lVar31;
        if ((int)uVar34 != lVar31) {
          QIntC::IntConverter<long_long,_int,_true,_true>::error(lVar31);
        }
        uVar29 = local_1c0;
        if (uVar36 != uVar34) {
          uVar36 = 1;
          if (9 < local_1c0) {
            uVar38 = 4;
            uVar24 = local_1c0;
            do {
              uVar36 = uVar38;
              uVar39 = (uint)uVar24;
              if (uVar39 < 100) {
                uVar36 = uVar36 - 2;
                goto LAB_00220cdb;
              }
              if (uVar39 < 1000) {
                uVar36 = uVar36 - 1;
                goto LAB_00220cdb;
              }
              if (uVar39 < 10000) goto LAB_00220cdb;
              uVar24 = (uVar24 & 0xffffffff) / 10000;
              uVar38 = uVar36 + 4;
            } while (99999 < uVar39);
            uVar36 = uVar36 + 1;
          }
LAB_00220cdb:
          local_60[0] = local_50;
          local_f0 = QVar37;
          std::__cxx11::string::_M_construct((ulong)local_60,(char)uVar36);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_60[0],uVar36,(uint)uVar29);
          plVar15 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x289bee);
          local_1b8 = &local_1a8;
          pp_Var21 = (_Base_ptr *)(plVar15 + 2);
          if ((_Base_ptr *)*plVar15 == pp_Var21) {
            local_1a8 = *pp_Var21;
            lStack_1a0 = plVar15[3];
          }
          else {
            local_1a8 = *pp_Var21;
            local_1b8 = (_Base_ptr *)*plVar15;
          }
          local_1b0 = plVar15[1];
          *plVar15 = (long)pp_Var21;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          local_178 = &local_168;
          puVar22 = (ulong *)(plVar15 + 2);
          if ((ulong *)*plVar15 == puVar22) {
            local_168 = *puVar22;
            lStack_160 = plVar15[3];
          }
          else {
            local_168 = *puVar22;
            local_178 = (ulong *)*plVar15;
          }
          local_170 = plVar15[1];
          *plVar15 = (long)puVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          uVar36 = -uVar34;
          if (0 < (int)uVar34) {
            uVar36 = uVar34;
          }
          uVar38 = 1;
          if (9 < uVar36) {
            uVar29 = (ulong)uVar36;
            uVar39 = 4;
            do {
              uVar38 = uVar39;
              uVar10 = (uint)uVar29;
              if (uVar10 < 100) {
                uVar38 = uVar38 - 2;
                goto LAB_00220e52;
              }
              if (uVar10 < 1000) {
                uVar38 = uVar38 - 1;
                goto LAB_00220e52;
              }
              if (uVar10 < 10000) goto LAB_00220e52;
              uVar29 = uVar29 / 10000;
              uVar39 = uVar38 + 4;
            } while (99999 < uVar10);
            uVar38 = uVar38 + 1;
          }
LAB_00220e52:
          local_98 = local_88;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_98,(char)uVar38 - ((char)((ulong)lVar31 >> 0x18) >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar34 >> 0x1f) + (long)local_98),uVar38,uVar36);
          QVar37 = local_f0;
          uVar29 = 0xf;
          if (local_178 != &local_168) {
            uVar29 = local_168;
          }
          if (uVar29 < (ulong)(local_90 + local_170)) {
            uVar29 = 0xf;
            if (local_98 != local_88) {
              uVar29 = local_88[0];
            }
            if (uVar29 < (ulong)(local_90 + local_170)) goto LAB_00220ef9;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_178)
            ;
          }
          else {
LAB_00220ef9:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_98);
          }
          plVar15 = puVar16 + 2;
          if ((long *)*puVar16 == plVar15) {
            local_188 = *plVar15;
            uStack_180 = puVar16[3];
            local_198 = &local_188;
          }
          else {
            local_188 = *plVar15;
            local_198 = (long *)*puVar16;
          }
          local_190 = puVar16[1];
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(undefined1 *)plVar15 = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_198);
          local_1e0 = &local_1d0;
          pp_Var21 = (_Base_ptr *)(plVar15 + 2);
          if ((_Base_ptr *)*plVar15 == pp_Var21) {
            local_1d0 = *pp_Var21;
            lStack_1c8 = plVar15[3];
          }
          else {
            local_1d0 = *pp_Var21;
            local_1e0 = (_Base_ptr *)*plVar15;
          }
          local_1d8 = plVar15[1];
          *plVar15 = (long)pp_Var21;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          uVar34 = QVar37.obj;
          uVar36 = -uVar34;
          if (0 < (int)uVar34) {
            uVar36 = uVar34;
          }
          uVar34 = 1;
          if (9 < uVar36) {
            uVar29 = (ulong)uVar36;
            uVar38 = 4;
            do {
              uVar34 = uVar38;
              uVar39 = (uint)uVar29;
              if (uVar39 < 100) {
                uVar34 = uVar34 - 2;
                goto LAB_00221028;
              }
              if (uVar39 < 1000) {
                uVar34 = uVar34 - 1;
                goto LAB_00221028;
              }
              if (uVar39 < 10000) goto LAB_00221028;
              uVar29 = uVar29 / 10000;
              uVar38 = uVar34 + 4;
            } while (99999 < uVar39);
            uVar34 = uVar34 + 1;
          }
LAB_00221028:
          uVar29 = (ulong)local_f0 >> 0x1f;
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_b8,(char)uVar34 - (local_f0.obj._3_1_ >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((uVar29 & 1) + (long)local_b8),uVar34,uVar36);
          p_Var17 = (_Base_ptr)0xf;
          if (local_1e0 != &local_1d0) {
            p_Var17 = local_1d0;
          }
          if (p_Var17 < (_Base_ptr)(local_b0 + local_1d8)) {
            p_Var17 = (_Base_ptr)0xf;
            if (local_b8 != local_a8) {
              p_Var17 = local_a8[0];
            }
            if (p_Var17 < (_Base_ptr)(local_b0 + local_1d8)) goto LAB_002210cc;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_1e0)
            ;
          }
          else {
LAB_002210cc:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_b8);
          }
          puVar22 = puVar16 + 2;
          if ((ulong *)*puVar16 == puVar22) {
            local_1f8 = *puVar22;
            uStack_1f0 = puVar16[3];
            local_208 = &local_1f8;
          }
          else {
            local_1f8 = *puVar22;
            local_208 = (ulong *)*puVar16;
          }
          local_200 = puVar16[1];
          *puVar16 = puVar22;
          puVar16[1] = 0;
          *(undefined1 *)puVar22 = 0;
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          puVar22 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_228.field_2._M_allocated_capacity = *puVar22;
            local_228.field_2._8_8_ = puVar16[3];
          }
          else {
            local_228.field_2._M_allocated_capacity = *puVar22;
            local_228._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_228._M_string_length = puVar16[1];
          *puVar16 = puVar22;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          uVar29 = -uVar14;
          if (0 < (long)uVar14) {
            uVar29 = uVar14;
          }
          uVar36 = 1;
          if (9 < uVar29) {
            uVar24 = uVar29;
            uVar34 = 4;
            do {
              uVar36 = uVar34;
              if (uVar24 < 100) {
                uVar36 = uVar36 - 2;
                goto LAB_002211f5;
              }
              if (uVar24 < 1000) {
                uVar36 = uVar36 - 1;
                goto LAB_002211f5;
              }
              if (uVar24 < 10000) goto LAB_002211f5;
              bVar7 = 99999 < uVar24;
              uVar24 = uVar24 / 10000;
              uVar34 = uVar36 + 4;
            } while (bVar7);
            uVar36 = uVar36 + 1;
          }
LAB_002211f5:
          local_d8 = local_c8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_d8,(char)uVar36 - (char)((long)uVar14 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long_long>
                    ((char *)((long)local_d8 - ((long)uVar14 >> 0x3f)),uVar36,uVar29);
          uVar35 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            uVar35 = local_228.field_2._M_allocated_capacity;
          }
          pp_Var21 = &local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
          if ((ulong)uVar35 < local_d0 + local_228._M_string_length) {
            uVar29 = 0xf;
            if (local_d8 != local_c8) {
              uVar29 = local_c8[0];
            }
            if (uVar29 < local_d0 + local_228._M_string_length) goto LAB_0022128f;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_d8,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
          }
          else {
LAB_0022128f:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_d8);
          }
          plVar15 = puVar16 + 2;
          if ((_Base_ptr *)*puVar16 == (_Base_ptr *)plVar15) {
            local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
            local_128._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar16[3];
            local_128._M_impl._0_8_ = pp_Var21;
          }
          else {
            local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
            local_128._M_impl._0_8_ = (_Base_ptr *)*puVar16;
          }
          local_128._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar16[1];
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(undefined1 *)plVar15 = 0;
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
          local_158._0_8_ = local_158 + 0x10;
          psVar25 = puVar16 + 2;
          if ((size_type *)*puVar16 == psVar25) {
            local_158._16_8_ = *psVar25;
            local_158._24_8_ = puVar16[3];
          }
          else {
            local_158._16_8_ = *psVar25;
            local_158._0_8_ = (size_type *)*puVar16;
          }
          local_158._8_8_ = puVar16[1];
          *puVar16 = psVar25;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          msg_01._M_str = (char *)local_158._0_8_;
          msg_01._M_len = local_158._8_8_;
          linearizationWarning(local_1e8,msg_01);
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          if ((_Base_ptr *)local_128._M_impl._0_8_ != pp_Var21) {
            operator_delete((void *)local_128._M_impl._0_8_,
                            (ulong)((long)&(local_128._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          if (local_d8 != local_c8) {
            operator_delete(local_d8,local_c8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if (local_208 != &local_1f8) {
            operator_delete(local_208,local_1f8 + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,(ulong)((long)&local_a8[0]->_M_color + 1));
          }
          if (local_1e0 != &local_1d0) {
            operator_delete(local_1e0,(ulong)((long)&local_1d0->_M_color + 1));
          }
          if (local_198 != &local_188) {
            operator_delete(local_198,local_188 + 1);
          }
          shared_idx_to_obj = local_e8;
          if (local_98 != local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168 + 1);
          }
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,(ulong)((long)&local_1a8->_M_color + 1));
          }
          if (local_60[0] != local_50) {
            operator_delete(local_60[0],local_50[0] + 1);
          }
        }
        local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
        local_158._16_8_ = (undefined1 *)0x0;
        local_158._24_8_ = local_158 + 8;
        local_130 = 0;
        local_128._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_128._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_128._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_128._M_impl.super__Rb_tree_header._M_header;
        local_128._M_impl.super__Rb_tree_header._M_header._M_right =
             local_128._M_impl.super__Rb_tree_header._M_header._M_left;
        local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_138 = (_Rb_tree_node_base *)local_158._24_8_;
        if ((local_1c0 == 0) && (0 < piVar32[4])) {
          msg_02._M_str = "page 0 has shared identifier entries";
          msg_02._M_len = 0x24;
          linearizationWarning(local_1e8,msg_02);
        }
        uVar29 = 0;
        paVar1 = &local_228.field_2;
        while( true ) {
          if (piVar32[4] < 0) {
            QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(piVar32[4]);
          }
          if ((ulong)(long)piVar32[4] <= uVar29) break;
          if ((ulong)(*(long *)(piVar32 + 8) - *(long *)(piVar32 + 6) >> 2) <= uVar29) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar29);
          }
          iVar2 = *(int *)(*(long *)(piVar32 + 6) + uVar29 * 4);
          local_208 = (ulong *)CONCAT44(local_208._4_4_,iVar2);
          p_Var26 = local_e0;
          for (p_Var17 = (shared_idx_to_obj->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
              ; (_Rb_tree_header *)p_Var17 != (_Rb_tree_header *)0x0;
              p_Var17 = (&p_Var17->_M_left)[(int)*(size_t *)(p_Var17 + 1) < iVar2]) {
            if (iVar2 <= (int)*(size_t *)(p_Var17 + 1)) {
              p_Var26 = (_Rb_tree_header *)p_Var17;
            }
          }
          p_Var30 = local_e0;
          if ((p_Var26 != local_e0) && (p_Var30 = p_Var26, iVar2 < (int)p_Var26->_M_node_count)) {
            p_Var30 = local_e0;
          }
          if (p_Var30 == local_e0) {
            local_228._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,
                       "unable to get object for item in shared objects hint table","");
            stopOnError(local_1e8,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != paVar1) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
          }
          __v = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](shared_idx_to_obj,(key_type *)&local_208);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     local_158,__v);
          uVar29 = uVar29 + 1;
        }
        uVar29 = 0;
        while( true ) {
          puVar9 = local_70;
          pQVar40 = local_1e8;
          if ((int)local_70[1] < 0) {
            QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(local_70[1]);
          }
          if ((ulong)(long)(int)puVar9[1] <= uVar29) break;
          if ((ulong)(*(long *)(puVar9 + 4) - *(long *)(puVar9 + 2) >> 2) <= uVar29) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar29);
          }
          iVar2 = *(int *)(*(long *)(puVar9 + 2) + uVar29 * 4);
          uVar24 = (ulong)iVar2;
          if (*(int *)((long)&((pQVar40->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                              c_shared_object_data + 8) <= iVar2) {
            local_228._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,"index out of bounds for shared object hint table","");
            stopOnError(pQVar40,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != paVar1) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
          }
          _Var4._M_head_impl =
               (pQVar40->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
          if (iVar2 < 0) {
            QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar2);
          }
          lVar31 = *(long *)&((vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                               *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 0x10))->
                             super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
          ;
          if ((ulong)((long)*(pointer *)((long)&(_Var4._M_head_impl)->c_shared_object_data + 0x18) -
                      lVar31 >> 2) <= uVar24) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar24);
          }
          local_228._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar31 + uVar24 * 4);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_128,(int *)&local_228);
          uVar29 = uVar29 + 1;
        }
        p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var18 = (_Rb_tree_node_base *)local_158._24_8_;
        if ((_Rb_tree_node_base *)local_158._24_8_ != (_Rb_tree_node_base *)(local_158 + 8)) {
          do {
            _Var3 = p_Var18[1]._M_color;
            p_Var17 = &local_128._M_impl.super__Rb_tree_header._M_header;
            for (p_Var27 = local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var27 != (_Base_ptr)0x0;
                p_Var27 = (&p_Var27->_M_left)[(int)p_Var27[1]._M_color < (int)_Var3]) {
              if ((int)_Var3 <= (int)p_Var27[1]._M_color) {
                p_Var17 = p_Var27;
              }
            }
            p_Var26 = &local_128._M_impl.super__Rb_tree_header;
            p_Var27 = &p_Var26->_M_header;
            if (((_Rb_tree_header *)p_Var17 != p_Var26) &&
               (p_Var27 = p_Var17, (int)_Var3 < (int)p_Var17[1]._M_color)) {
              p_Var27 = &p_Var26->_M_header;
            }
            if ((_Rb_tree_header *)p_Var27 == p_Var26) {
              uVar36 = 1;
              if (9 < local_1c0) {
                uVar29 = local_1c0;
                uVar34 = 4;
                do {
                  uVar36 = uVar34;
                  uVar38 = (uint)uVar29;
                  if (uVar38 < 100) {
                    uVar36 = uVar36 - 2;
                    goto LAB_00221837;
                  }
                  if (uVar38 < 1000) {
                    uVar36 = uVar36 - 1;
                    goto LAB_00221837;
                  }
                  if (uVar38 < 10000) goto LAB_00221837;
                  uVar29 = (uVar29 & 0xffffffff) / 10000;
                  uVar34 = uVar36 + 4;
                } while (99999 < uVar38);
                uVar36 = uVar36 + 1;
              }
LAB_00221837:
              local_178 = &local_168;
              std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar36);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_178,uVar36,(uint)local_1c0);
              puVar16 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x273fd9);
              local_198 = &local_188;
              plVar15 = puVar16 + 2;
              if ((long *)*puVar16 == plVar15) {
                local_188 = *plVar15;
                uStack_180 = puVar16[3];
              }
              else {
                local_188 = *plVar15;
                local_198 = (long *)*puVar16;
              }
              local_190 = puVar16[1];
              *puVar16 = plVar15;
              puVar16[1] = 0;
              *(undefined1 *)(puVar16 + 2) = 0;
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_198);
              pQVar40 = local_1e8;
              pp_Var21 = (_Base_ptr *)(plVar15 + 2);
              if ((_Base_ptr *)*plVar15 == pp_Var21) {
                local_1d0 = *pp_Var21;
                lStack_1c8 = plVar15[3];
                local_1e0 = &local_1d0;
              }
              else {
                local_1d0 = *pp_Var21;
                local_1e0 = (_Base_ptr *)*plVar15;
              }
              local_1d8 = plVar15[1];
              *plVar15 = (long)pp_Var21;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              _Var8 = -_Var3;
              if (0 < (int)_Var3) {
                _Var8 = _Var3;
              }
              uVar36 = 1;
              if (9 < _Var8) {
                uVar29 = (ulong)_Var8;
                uVar34 = 4;
                do {
                  uVar36 = uVar34;
                  uVar38 = (uint)uVar29;
                  if (uVar38 < 100) {
                    uVar36 = uVar36 - 2;
                    goto LAB_00221987;
                  }
                  if (uVar38 < 1000) {
                    uVar36 = uVar36 - 1;
                    goto LAB_00221987;
                  }
                  if (uVar38 < 10000) goto LAB_00221987;
                  uVar29 = uVar29 / 10000;
                  uVar34 = uVar36 + 4;
                } while (99999 < uVar38);
                uVar36 = uVar36 + 1;
              }
LAB_00221987:
              local_1b8 = &local_1a8;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_1b8,(char)uVar36 - (char)((int)_Var3 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((ulong)(_Var3 >> 0x1f) + (long)local_1b8),uVar36,_Var8);
              p_Var17 = (_Base_ptr)0xf;
              if (local_1e0 != &local_1d0) {
                p_Var17 = local_1d0;
              }
              if (p_Var17 < (_Base_ptr)(local_1b0 + local_1d8)) {
                p_Var17 = (_Base_ptr)0xf;
                if (local_1b8 != &local_1a8) {
                  p_Var17 = local_1a8;
                }
                if (p_Var17 < (_Base_ptr)(local_1b0 + local_1d8)) goto LAB_00221a13;
                puVar16 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1e0);
              }
              else {
LAB_00221a13:
                puVar16 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_1b8);
              }
              local_208 = &local_1f8;
              puVar22 = puVar16 + 2;
              if ((ulong *)*puVar16 == puVar22) {
                local_1f8 = *puVar22;
                uStack_1f0 = puVar16[3];
              }
              else {
                local_1f8 = *puVar22;
                local_208 = (ulong *)*puVar16;
              }
              local_200 = puVar16[1];
              *puVar16 = puVar22;
              puVar16[1] = 0;
              *(undefined1 *)puVar22 = 0;
              puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
              local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
              puVar22 = puVar16 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar22) {
                local_228.field_2._M_allocated_capacity = *puVar22;
                local_228.field_2._8_8_ = puVar16[3];
              }
              else {
                local_228.field_2._M_allocated_capacity = *puVar22;
                local_228._M_dataplus._M_p = (pointer)*puVar16;
              }
              local_228._M_string_length = puVar16[1];
              *puVar16 = puVar22;
              puVar16[1] = 0;
              *(undefined1 *)(puVar16 + 2) = 0;
              msg_03._M_str = local_228._M_dataplus._M_p;
              msg_03._M_len = local_228._M_string_length;
              linearizationWarning(pQVar40,msg_03);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                operator_delete(local_228._M_dataplus._M_p,
                                local_228.field_2._M_allocated_capacity + 1);
              }
              if (local_208 != &local_1f8) {
                operator_delete(local_208,local_1f8 + 1);
              }
              if (local_1b8 != &local_1a8) {
                operator_delete(local_1b8,(ulong)((long)&local_1a8->_M_color + 1));
              }
              shared_idx_to_obj = local_e8;
              if (local_1e0 != &local_1d0) {
                operator_delete(local_1e0,(ulong)((long)&local_1d0->_M_color + 1));
              }
              if (local_198 != &local_188) {
                operator_delete(local_198,local_188 + 1);
              }
              if (local_178 != &local_168) {
                operator_delete(local_178,local_168 + 1);
              }
            }
            p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
            p_Var20 = local_128._M_impl.super__Rb_tree_header._M_header._M_left;
          } while (p_Var18 != (_Rb_tree_node_base *)(local_158 + 8));
        }
        for (; puVar33 = local_158 + 8,
            (_Rb_tree_header *)p_Var20 != &local_128._M_impl.super__Rb_tree_header;
            p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
          _Var3 = p_Var20[1]._M_color;
          puVar19 = puVar33;
          for (puVar28 = (undefined1 *)local_158._16_8_; puVar28 != (undefined1 *)0x0;
              puVar28 = *(undefined1 **)
                         (puVar28 + ((ulong)(*(int *)(puVar28 + 0x20) < (int)_Var3) + 2) * 8)) {
            if ((int)_Var3 <= *(int *)(puVar28 + 0x20)) {
              puVar19 = puVar28;
            }
          }
          puVar28 = puVar33;
          if ((puVar19 != puVar33) && (puVar28 = puVar19, (int)_Var3 < *(int *)(puVar19 + 0x20))) {
            puVar28 = puVar33;
          }
          if (puVar28 == puVar33) {
            uVar36 = 1;
            if (9 < local_1c0) {
              uVar29 = local_1c0;
              uVar34 = 4;
              do {
                uVar36 = uVar34;
                uVar38 = (uint)uVar29;
                if (uVar38 < 100) {
                  uVar36 = uVar36 - 2;
                  goto LAB_00221c63;
                }
                if (uVar38 < 1000) {
                  uVar36 = uVar36 - 1;
                  goto LAB_00221c63;
                }
                if (uVar38 < 10000) goto LAB_00221c63;
                uVar29 = (uVar29 & 0xffffffff) / 10000;
                uVar34 = uVar36 + 4;
              } while (99999 < uVar38);
              uVar36 = uVar36 + 1;
            }
LAB_00221c63:
            local_178 = &local_168;
            std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar36);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_178,uVar36,(uint)local_1c0);
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x273fd9);
            local_198 = &local_188;
            plVar15 = puVar16 + 2;
            if ((long *)*puVar16 == plVar15) {
              local_188 = *plVar15;
              uStack_180 = puVar16[3];
            }
            else {
              local_188 = *plVar15;
              local_198 = (long *)*puVar16;
            }
            local_190 = puVar16[1];
            *puVar16 = plVar15;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_198);
            pQVar40 = local_1e8;
            pp_Var21 = (_Base_ptr *)(plVar15 + 2);
            if ((_Base_ptr *)*plVar15 == pp_Var21) {
              local_1d0 = *pp_Var21;
              lStack_1c8 = plVar15[3];
              local_1e0 = &local_1d0;
            }
            else {
              local_1d0 = *pp_Var21;
              local_1e0 = (_Base_ptr *)*plVar15;
            }
            local_1d8 = plVar15[1];
            *plVar15 = (long)pp_Var21;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            _Var8 = -_Var3;
            if (0 < (int)_Var3) {
              _Var8 = _Var3;
            }
            uVar36 = 1;
            if (9 < _Var8) {
              uVar29 = (ulong)_Var8;
              uVar34 = 4;
              do {
                uVar36 = uVar34;
                uVar38 = (uint)uVar29;
                if (uVar38 < 100) {
                  uVar36 = uVar36 - 2;
                  goto LAB_00221db3;
                }
                if (uVar38 < 1000) {
                  uVar36 = uVar36 - 1;
                  goto LAB_00221db3;
                }
                if (uVar38 < 10000) goto LAB_00221db3;
                uVar29 = uVar29 / 10000;
                uVar34 = uVar36 + 4;
              } while (99999 < uVar38);
              uVar36 = uVar36 + 1;
            }
LAB_00221db3:
            local_1b8 = &local_1a8;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_1b8,(char)uVar36 - (char)((int)_Var3 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(_Var3 >> 0x1f) + (long)local_1b8),uVar36,_Var8);
            p_Var17 = (_Base_ptr)0xf;
            if (local_1e0 != &local_1d0) {
              p_Var17 = local_1d0;
            }
            if (p_Var17 < (_Base_ptr)(local_1b0 + local_1d8)) {
              p_Var17 = (_Base_ptr)0xf;
              if (local_1b8 != &local_1a8) {
                p_Var17 = local_1a8;
              }
              if (p_Var17 < (_Base_ptr)(local_1b0 + local_1d8)) goto LAB_00221e3f;
              puVar16 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1e0);
            }
            else {
LAB_00221e3f:
              puVar16 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_1b8);
            }
            local_208 = &local_1f8;
            puVar22 = puVar16 + 2;
            if ((ulong *)*puVar16 == puVar22) {
              local_1f8 = *puVar22;
              uStack_1f0 = puVar16[3];
            }
            else {
              local_1f8 = *puVar22;
              local_208 = (ulong *)*puVar16;
            }
            local_200 = puVar16[1];
            *puVar16 = puVar22;
            puVar16[1] = 0;
            *(undefined1 *)puVar22 = 0;
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            puVar22 = puVar16 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar22) {
              local_228.field_2._M_allocated_capacity = *puVar22;
              local_228.field_2._8_8_ = puVar16[3];
            }
            else {
              local_228.field_2._M_allocated_capacity = *puVar22;
              local_228._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_228._M_string_length = puVar16[1];
            *puVar16 = puVar22;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            msg_04._M_str = local_228._M_dataplus._M_p;
            msg_04._M_len = local_228._M_string_length;
            linearizationWarning(pQVar40,msg_04);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,local_1f8 + 1);
            }
            if (local_1b8 != &local_1a8) {
              operator_delete(local_1b8,(ulong)((long)&local_1a8->_M_color + 1));
            }
            shared_idx_to_obj = local_e8;
            if (local_1e0 != &local_1d0) {
              operator_delete(local_1e0,(ulong)((long)&local_1d0->_M_color + 1));
            }
            if (local_198 != &local_188) {
              operator_delete(local_198,local_188 + 1);
            }
            if (local_178 != &local_168) {
              operator_delete(local_178,local_168 + 1);
            }
          }
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_128);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_158);
        uVar24 = local_1c0 + 1;
      } while (uVar24 != local_f8);
    }
    return;
  }
  uVar24 = 0;
  uVar29 = 0;
LAB_0022205d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar24,
             uVar29);
}

Assistant:

void
QPDF::checkHPageOffset(
    std::vector<QPDFObjectHandle> const& pages, std::map<int, int>& shared_idx_to_obj)
{
    // Implementation note 126 says Acrobat always sets delta_content_offset and
    // delta_content_length in the page offset header dictionary to 0.  It also states that
    // min_content_offset in the per-page information is always 0, which is an incorrect value.

    // Implementation note 127 explains that Acrobat always sets item 8 (min_content_length) to
    // zero, item 9 (nbits_delta_content_length) to the value of item 5 (nbits_delta_page_length),
    // and item 7 of each per-page hint table (delta_content_length) to item 2 (delta_page_length)
    // of that entry.  Acrobat ignores these values when reading files.

    // Empirically, it also seems that Acrobat sometimes puts items under a page's /Resources
    // dictionary in with shared objects even when they are private.

    int npages = toI(pages.size());
    qpdf_offset_t table_offset = adjusted_offset(m->page_offset_hints.first_page_offset);
    QPDFObjGen first_page_og(pages.at(0).getObjGen());
    if (m->xref_table.count(first_page_og) == 0) {
        stopOnError("supposed first page object is not known");
    }
    qpdf_offset_t offset = getLinearizationOffset(first_page_og);
    if (table_offset != offset) {
        linearizationWarning("first page object offset mismatch");
    }

    for (int pageno = 0; pageno < npages; ++pageno) {
        QPDFObjGen page_og(pages.at(toS(pageno)).getObjGen());
        int first_object = page_og.getObj();
        if (m->xref_table.count(page_og) == 0) {
            stopOnError("unknown object in page offset hint table");
        }
        offset = getLinearizationOffset(page_og);

        HPageOffsetEntry& he = m->page_offset_hints.entries.at(toS(pageno));
        CHPageOffsetEntry& ce = m->c_page_offset_data.entries.at(toS(pageno));
        int h_nobjects = he.delta_nobjects + m->page_offset_hints.min_nobjects;
        if (h_nobjects != ce.nobjects) {
            // This happens with pdlin when there are thumbnails.
            linearizationWarning(
                "object count mismatch for page " + std::to_string(pageno) + ": hint table = " +
                std::to_string(h_nobjects) + "; computed = " + std::to_string(ce.nobjects));
        }

        // Use value for number of objects in hint table rather than computed value if there is a
        // discrepancy.
        int length = lengthNextN(first_object, h_nobjects);
        int h_length = toI(he.delta_page_length + m->page_offset_hints.min_page_length);
        if (length != h_length) {
            // This condition almost certainly indicates a bad hint table or a bug in this code.
            linearizationWarning(
                "page length mismatch for page " + std::to_string(pageno) + ": hint table = " +
                std::to_string(h_length) + "; computed length = " + std::to_string(length) +
                " (offset = " + std::to_string(offset) + ")");
        }

        offset += h_length;

        // Translate shared object indexes to object numbers.
        std::set<int> hint_shared;
        std::set<int> computed_shared;

        if ((pageno == 0) && (he.nshared_objects > 0)) {
            // pdlin and Acrobat both do this even though the spec states clearly and unambiguously
            // that they should not.
            linearizationWarning("page 0 has shared identifier entries");
        }

        for (size_t i = 0; i < toS(he.nshared_objects); ++i) {
            int idx = he.shared_identifiers.at(i);
            if (shared_idx_to_obj.count(idx) == 0) {
                stopOnError("unable to get object for item in shared objects hint table");
            }
            hint_shared.insert(shared_idx_to_obj[idx]);
        }

        for (size_t i = 0; i < toS(ce.nshared_objects); ++i) {
            int idx = ce.shared_identifiers.at(i);
            if (idx >= m->c_shared_object_data.nshared_total) {
                stopOnError("index out of bounds for shared object hint table");
            }
            int obj = m->c_shared_object_data.entries.at(toS(idx)).object;
            computed_shared.insert(obj);
        }

        for (int iter: hint_shared) {
            if (!computed_shared.count(iter)) {
                // pdlin puts thumbnails here even though it shouldn't
                linearizationWarning(
                    "page " + std::to_string(pageno) + ": shared object " + std::to_string(iter) +
                    ": in hint table but not computed list");
            }
        }

        for (int iter: computed_shared) {
            if (!hint_shared.count(iter)) {
                // Acrobat does not put some things including at least built-in fonts and procsets
                // here, at least in some cases.
                linearizationWarning(
                    ("page " + std::to_string(pageno) + ": shared object " + std::to_string(iter) +
                     ": in computed list but not hint table"));
            }
        }
    }
}